

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmem.c
# Opt level: O1

void * luaM_realloc_(lua_State *L,void *block,size_t osize,size_t nsize)

{
  global_State *pgVar1;
  void *pvVar2;
  
  pgVar1 = L->l_G;
  pvVar2 = (*pgVar1->frealloc)(pgVar1->ud,block,osize,nsize);
  if (((nsize != 0) && (pvVar2 == (void *)0x0)) &&
     (pvVar2 = tryagain(L,block,osize,nsize), pvVar2 == (void *)0x0)) {
    return (void *)0x0;
  }
  pgVar1->GCdebt = pgVar1->GCdebt + (osize - nsize);
  return pvVar2;
}

Assistant:

void *luaM_realloc_ (lua_State *L, void *block, size_t osize, size_t nsize) {
  void *newblock;
  global_State *g = G(L);
  lua_assert((osize == 0) == (block == NULL));
  newblock = firsttry(g, block, osize, nsize);
  if (l_unlikely(newblock == NULL && nsize > 0)) {
    newblock = tryagain(L, block, osize, nsize);
    if (newblock == NULL)  /* still no memory? */
      return NULL;  /* do not update 'GCdebt' */
  }
  lua_assert((nsize == 0) == (newblock == NULL));
  g->GCdebt -= cast(l_mem, nsize) - cast(l_mem, osize);
  return newblock;
}